

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O1

string * testing::internal::FormatDeathTestOutput(string *__return_storage_ptr__,string *output)

{
  long lVar1;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  do {
    lVar1 = std::__cxx11::string::find((char)output,10);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (lVar1 == -1) {
      std::__cxx11::string::substr((ulong)local_58,(ulong)output);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58[0]);
      if (local_58[0] != local_48) {
        operator_delete(local_58[0]);
      }
    }
    else {
      std::__cxx11::string::substr((ulong)local_58,(ulong)output);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58[0]);
      if (local_58[0] != local_48) {
        operator_delete(local_58[0]);
      }
    }
  } while (lVar1 != -1);
  return __return_storage_ptr__;
}

Assistant:

static ::std::string FormatDeathTestOutput(const ::std::string& output) {
  ::std::string ret;
  for (size_t at = 0; ; ) {
    const size_t line_end = output.find('\n', at);
    ret += "[  DEATH   ] ";
    if (line_end == ::std::string::npos) {
      ret += output.substr(at);
      break;
    }
    ret += output.substr(at, line_end + 1 - at);
    at = line_end + 1;
  }
  return ret;
}